

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

void arkInterpPrintMem_Lagrange(ARKInterp I,FILE *outfile)

{
  FILE *in_RSI;
  long *in_RDI;
  int i;
  int local_14;
  
  if (in_RDI != (long *)0x0) {
    fprintf(in_RSI,"arkode_interp (Lagrange): nmax = %i\n",(ulong)*(uint *)*in_RDI);
    fprintf(in_RSI,"arkode_interp (Lagrange): nhist = %i\n",(ulong)*(uint *)(*in_RDI + 0x18));
    if (*(long *)(*in_RDI + 0x10) != 0) {
      fprintf(in_RSI,"arkode_interp (Lagrange): thist =");
      for (local_14 = 0; local_14 < *(int *)*in_RDI; local_14 = local_14 + 1) {
        fprintf(in_RSI,"  %.16g",*(undefined8 *)(*(long *)(*in_RDI + 0x10) + (long)local_14 * 8));
      }
      fprintf(in_RSI,"\n");
    }
    if (*(long *)(*in_RDI + 8) != 0) {
      fprintf(in_RSI,"arkode_interp (Lagrange): yhist ptrs =");
      for (local_14 = 0; local_14 < *(int *)*in_RDI; local_14 = local_14 + 1) {
        fprintf(in_RSI,"  %p",*(undefined8 *)(*(long *)(*in_RDI + 8) + (long)local_14 * 8));
      }
      fprintf(in_RSI,"\n");
    }
  }
  return;
}

Assistant:

void arkInterpPrintMem_Lagrange(ARKInterp I, FILE *outfile)
{
  int i;
  if (I != NULL) {
    fprintf(outfile, "arkode_interp (Lagrange): nmax = %i\n", LINT_NMAX(I));
    fprintf(outfile, "arkode_interp (Lagrange): nhist = %i\n", LINT_NHIST(I));
    if (LINT_THIST(I) != NULL) {
      fprintf(outfile, "arkode_interp (Lagrange): thist =");
      for (i=0; i<LINT_NMAX(I); i++)
        fprintf(outfile, "  %"RSYM,LINT_TJ(I,i));
      fprintf(outfile, "\n");
    }
    if (LINT_YHIST(I) != NULL) {
      fprintf(outfile, "arkode_interp (Lagrange): yhist ptrs =");
      for (i=0; i<LINT_NMAX(I); i++)
        fprintf(outfile, "  %p",(void*) LINT_YJ(I,i));
      fprintf(outfile, "\n");
    }
#ifdef SUNDIALS_DEBUG_PRINTVEC
    if (LINT_YHIST(I) != NULL) {
      for (i=0; i<LINT_NMAX(I); i++) {
        fprintf(outfile, "arkode_interp (Lagrange): yhist[%i]:\n",i);
        N_VPrintFile(LINT_YJ(I,i), outfile);
      }
    }
#endif
  }
}